

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O1

size_t __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::GetBufferedLength
          (BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *this,size_t markerIndex)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  size_t sVar3;
  _Base_ptr p_Var4;
  
  p_Var1 = &(this->Markers)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < markerIndex]
      ) {
    if (*(ulong *)(p_Var4 + 1) >= markerIndex) {
      p_Var2 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (p_Var4 = p_Var2, markerIndex < *(ulong *)(p_Var2 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  sVar3 = 0;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    sVar3 = this->Pos - markerIndex;
  }
  return sVar3;
}

Assistant:

size_t BacktrackingTokenStream<Token>::GetBufferedLength(size_t markerIndex) const {
    // If not found, we fail
    if (Markers.find(markerIndex) == Markers.end())
        return 0u;
    return Pos - markerIndex;
}